

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

size_t mpn_get_str_other(uchar *sp,int base,mpn_base_info *info,mp_ptr up,mp_size_t un)

{
  uchar uVar1;
  mp_limb_t mVar2;
  mp_limb_t w;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  uchar *puVar6;
  long lVar7;
  gmp_div_inverse binv;
  gmp_div_inverse bbinv;
  
  mpn_div_qr_1_invert(&binv,(long)base);
  if (un < 2) {
    lVar7 = 0;
  }
  else {
    mpn_div_qr_1_invert(&bbinv,info->bb);
    lVar7 = 0;
    do {
      w = mpn_div_qr_1_preinv(up,up,un,&bbinv);
      mVar2 = up[un + -1];
      uVar3 = mpn_limb_get_str(sp + lVar7,w,&binv);
      lVar7 = lVar7 + uVar3;
      for (; uVar3 < info->exp; uVar3 = uVar3 + 1) {
        sp[lVar7] = '\0';
        lVar7 = lVar7 + 1;
      }
      un = un - (ulong)(mVar2 == 0);
    } while (1 < un);
  }
  sVar4 = mpn_limb_get_str(sp + lVar7,*up,&binv);
  uVar5 = sVar4 + lVar7;
  puVar6 = sp + uVar5;
  for (uVar3 = 1; puVar6 = puVar6 + -1, uVar3 < uVar5; uVar3 = uVar3 + 2) {
    uVar1 = *sp;
    *sp = *puVar6;
    *puVar6 = uVar1;
    sp = sp + 1;
  }
  return uVar5;
}

Assistant:

static size_t
mpn_get_str_other (unsigned char *sp,
		   int base, const struct mpn_base_info *info,
		   mp_ptr up, mp_size_t un)
{
  struct gmp_div_inverse binv;
  size_t sn;
  size_t i;

  mpn_div_qr_1_invert (&binv, base);

  sn = 0;

  if (un > 1)
    {
      struct gmp_div_inverse bbinv;
      mpn_div_qr_1_invert (&bbinv, info->bb);

      do
	{
	  mp_limb_t w;
	  size_t done;
	  w = mpn_div_qr_1_preinv (up, up, un, &bbinv);
	  un -= (up[un-1] == 0);
	  done = mpn_limb_get_str (sp + sn, w, &binv);

	  for (sn += done; done < info->exp; done++)
	    sp[sn++] = 0;
	}
      while (un > 1);
    }
  sn += mpn_limb_get_str (sp + sn, up[0], &binv);

  /* Reverse order */
  for (i = 0; 2*i + 1 < sn; i++)
    {
      unsigned char t = sp[i];
      sp[i] = sp[sn - i - 1];
      sp[sn - i - 1] = t;
    }

  return sn;
}